

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

void plutovg_surface_clear(plutovg_surface_t *surface,plutovg_color_t *color)

{
  uint color_00;
  uint32_t value;
  uint32_t *pixels;
  int y;
  uint32_t pixel;
  plutovg_color_t *color_local;
  plutovg_surface_t *surface_local;
  
  color_00 = plutovg_color_to_argb32(color);
  value = plutovg_premultiply_argb(color_00);
  for (pixels._0_4_ = 0; (int)pixels < surface->height; pixels._0_4_ = (int)pixels + 1) {
    plutovg_memfill32((uint *)(surface->data + surface->stride * (int)pixels),surface->width,value);
  }
  return;
}

Assistant:

void plutovg_surface_clear(plutovg_surface_t* surface, const plutovg_color_t* color)
{
    uint32_t pixel = plutovg_premultiply_argb(plutovg_color_to_argb32(color));
    for(int y = 0; y < surface->height; y++) {
        uint32_t* pixels = (uint32_t*)(surface->data + surface->stride * y);
        plutovg_memfill32(pixels, surface->width, pixel);
    }
}